

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsTTDRawBufferCopySyncIndirect
          (JsValueRef dst,size_t dstIndex,JsValueRef src,size_t srcIndex,size_t count)

{
  anon_class_40_5_c07ed4ad fn;
  size_t local_38;
  size_t count_local;
  size_t srcIndex_local;
  JsValueRef src_local;
  size_t dstIndex_local;
  JsValueRef dst_local;
  
  if (((dstIndex < 0x100000000) && (srcIndex < 0x100000000)) && (count < 0x100000000)) {
    fn.dstIndex = &srcIndex_local;
    fn.dst = &src_local;
    fn.src = (JsValueRef *)&count_local;
    fn.srcIndex = &local_38;
    fn.count = &dstIndex_local;
    local_38 = count;
    count_local = srcIndex;
    srcIndex_local = (size_t)src;
    src_local = (JsValueRef)dstIndex;
    dstIndex_local = (size_t)dst;
    dst_local._4_4_ = ContextAPIWrapper<false,JsTTDRawBufferCopySyncIndirect::__0>(fn);
  }
  else {
    dst_local._4_4_ = JsErrorInvalidArgument;
  }
  return dst_local._4_4_;
}

Assistant:

CHAKRA_API JsTTDRawBufferCopySyncIndirect(_In_ JsValueRef dst, _In_ size_t dstIndex, _In_ JsValueRef src, _In_ size_t srcIndex, _In_ size_t count)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    if(dstIndex > UINT32_MAX || srcIndex > UINT32_MAX || count > UINT32_MAX)
    {
        return JsErrorInvalidArgument;
    }

    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTRawBufferCopySync, dst, (uint32)dstIndex, src, (uint32)srcIndex, (uint32)count);

        return JsNoError;
    });
#endif
}